

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

BOOL __thiscall Js::FunctionBody::IsInterpreterThunk(FunctionBody *this)

{
  BOOL BVar1;
  uint uVar2;
  JavascriptMethod p_Var3;
  JavascriptMethod p_Var4;
  
  p_Var3 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
  p_Var4 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
  uVar2 = 1;
  if ((p_Var3 != InterpreterStackFrame::DelayDynamicInterpreterThunk) &&
     (p_Var4 != InterpreterStackFrame::StaticInterpreterThunk)) {
    BVar1 = IsDynamicInterpreterThunk(this);
    uVar2 = (uint)(BVar1 != 0);
  }
  return uVar2;
}

Assistant:

BOOL FunctionBody::IsInterpreterThunk() const
    {
        bool isInterpreterThunk = this->GetOriginalEntryPoint_Unchecked() == DefaultEntryThunk;
#if DYNAMIC_INTERPRETER_THUNK
        bool isStaticInterpreterThunk = this->GetOriginalEntryPoint_Unchecked() == InterpreterStackFrame::StaticInterpreterThunk;
        isInterpreterThunk = isInterpreterThunk || isStaticInterpreterThunk || IsDynamicInterpreterThunk();
#endif
        return isInterpreterThunk;
    }